

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

ostream * add_options(ostream *o,MetaContainer meta)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  MetaIterator *pMVar5;
  char *pcVar6;
  ostream *poVar7;
  ostream *in_RDI;
  MetaIterator a;
  MetaIterator m_2;
  MetaIterator __end1_2;
  MetaIterator __begin1_2;
  MetaContainer *__range1_2;
  MetaIterator m_1;
  MetaIterator __end1_1;
  MetaIterator __begin1_1;
  MetaContainer *__range1_1;
  MetaIterator m;
  MetaIterator __end1;
  MetaIterator __begin1;
  MetaContainer *__range1;
  bool has_options;
  int sym_idx;
  string sym_names;
  MetaContainer *in_stack_fffffffffffffe30;
  MetaIterator *in_stack_fffffffffffffe38;
  allocator<char> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  MetaIterator local_108;
  undefined1 *local_f8;
  undefined4 local_ec;
  char *local_e8;
  char *local_e0;
  MetaIterator local_d8;
  MetaIterator local_c8;
  MetaIterator local_b8;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  MetaIterator local_90;
  MetaIterator local_80;
  MetaIterator local_70;
  undefined1 *local_60;
  byte local_51;
  int local_50;
  allocator<char> local_39;
  string local_38 [32];
  ostream *local_18;
  undefined1 local_10 [8];
  ostream *local_8;
  
  local_18 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  std::allocator<char>::~allocator(&local_39);
  local_50 = 0;
  local_51 = 0;
  local_60 = local_10;
  local_70 = rtosc::Port::MetaContainer::begin(in_stack_fffffffffffffe30);
  local_80 = rtosc::Port::MetaContainer::end((MetaContainer *)0x10b6f6);
  while( true ) {
    local_90 = local_80;
    bVar2 = rtosc::Port::MetaIterator::operator!=(&local_70,local_80);
    if (!bVar2) break;
    pMVar5 = rtosc::Port::MetaIterator::operator*(&local_70);
    local_a0 = pMVar5->title;
    local_98 = pMVar5->value;
    pcVar4 = strstr(local_a0,"map ");
    if (pcVar4 != (char *)0x0) {
      local_51 = 1;
    }
    rtosc::Port::MetaIterator::operator++(in_stack_fffffffffffffe38);
  }
  local_a8 = local_10;
  local_b8 = rtosc::Port::MetaContainer::begin(in_stack_fffffffffffffe30);
  local_c8 = rtosc::Port::MetaContainer::end((MetaContainer *)0x10b860);
  while( true ) {
    local_d8 = local_c8;
    bVar2 = rtosc::Port::MetaIterator::operator!=(&local_b8,local_c8);
    if (!bVar2) break;
    pMVar5 = rtosc::Port::MetaIterator::operator*(&local_b8);
    local_e8 = pMVar5->title;
    local_e0 = pMVar5->value;
    iVar3 = strcmp(local_e8,"documentation");
    if (iVar3 != 0) {
      iVar3 = strcmp(local_e8,"parameter");
      if (iVar3 != 0) {
        iVar3 = strcmp(local_e8,"max");
        if (iVar3 != 0) {
          iVar3 = strcmp(local_e8,"min");
          if (iVar3 != 0) {
            printf("m.title = <%s>\n",local_e8);
          }
        }
      }
    }
    rtosc::Port::MetaIterator::operator++(in_stack_fffffffffffffe38);
  }
  if ((local_51 & 1) == 0) {
    local_8 = local_18;
  }
  else {
    std::operator<<(local_18,"    <hints>\n");
    local_f8 = local_10;
    local_108 = rtosc::Port::MetaContainer::begin(in_stack_fffffffffffffe30);
    a = rtosc::Port::MetaContainer::end((MetaContainer *)0x10ba12);
    while( true ) {
      bVar2 = rtosc::Port::MetaIterator::operator!=(&local_108,a);
      if (!bVar2) break;
      pMVar5 = rtosc::Port::MetaIterator::operator*(&local_108);
      pcVar4 = pMVar5->title;
      pcVar1 = pMVar5->value;
      pcVar6 = strstr(pcVar4,"map ");
      if (pcVar6 != (char *)0x0) {
        poVar7 = std::operator<<(local_18,"      <point symbol=\"");
        local_50 = local_50 + 1;
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        poVar7 = std::operator<<(poVar7,*pcVar6);
        std::operator<<(poVar7,"\" value=\"");
        poVar7 = std::operator<<(local_18,pcVar4 + 4);
        in_stack_fffffffffffffe38 = (MetaIterator *)std::operator<<(poVar7,"\">");
        poVar7 = std::operator<<((ostream *)in_stack_fffffffffffffe38,pcVar1);
        std::operator<<(poVar7,"</point>\n");
      }
      rtosc::Port::MetaIterator::operator++(in_stack_fffffffffffffe38);
    }
    std::operator<<(local_18,"    </hints>\n");
    local_8 = local_18;
  }
  local_ec = 1;
  std::__cxx11::string::~string(local_38);
  return local_8;
}

Assistant:

static ostream &add_options(ostream &o, Port::MetaContainer meta)
{
    string sym_names = "xyzabcdefghijklmnopqrstuvw";
    int sym_idx = 0;
    bool has_options = false;
    for(auto m:meta)
        if(strstr(m.title, "map "))
            has_options = true;
    for(auto m:meta)
        if(strcmp(m.title, "documentation") &&
                strcmp(m.title, "parameter") &&
                strcmp(m.title, "max") &&
                strcmp(m.title, "min"))
        printf("m.title = <%s>\n", m.title);

    if(!has_options)
        return o;

    o << "    <hints>\n";
    for(auto m:meta) {
        if(strstr(m.title, "map ")) {
            o << "      <point symbol=\"" << sym_names[sym_idx++] << "\" value=\"";
            o << m.title+4 << "\">" << m.value << "</point>\n";
        }
    }
    o << "    </hints>\n";

    return o;
}